

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O2

void pzshape::TPZShapeTriang::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int *piVar6;
  long *plVar7;
  int iVar8;
  double *pdVar9;
  int d;
  long lVar10;
  ulong uVar11;
  TPZFNMatrix<100,_double> *this;
  long lVar12;
  int xj;
  long row;
  ulong uVar13;
  ulong uVar14;
  TPZVec<long> ids;
  REAL out;
  TPZManVector<double,_1> outvec;
  TPZFNMatrix<50,_double> phin;
  TPZFNMatrix<50,_double> phiblend;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<100,_double> dphiblend;
  
  ShapeCorner(pt,phi,dphi);
  piVar6 = order->fStore;
  if ((((1 < *piVar6) || (1 < piVar6[1])) || (1 < piVar6[2])) || (2 < piVar6[3])) {
    TPZFNMatrix<50,_double>::TPZFNMatrix(&phiblend,7,1);
    this = &dphiblend;
    TPZFNMatrix<100,_double>::TPZFNMatrix(this,2,7);
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      pdVar9 = TPZFMatrix<double>::operator()(phi,lVar10,0);
      dVar1 = *pdVar9;
      this = (TPZFNMatrix<100,_double> *)&phiblend;
      pdVar9 = TPZFMatrix<double>::operator()((TPZFMatrix<double> *)&phiblend,lVar10,0);
      *pdVar9 = dVar1;
      for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
        pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar12,lVar10);
        dVar1 = *pdVar9;
        this = &dphiblend;
        pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar12,lVar10);
        *pdVar9 = dVar1;
      }
    }
    ShapeGenerating((TPZVec<double> *)this,&phiblend.super_TPZFMatrix<double>,
                    &dphiblend.super_TPZFMatrix<double>);
    lVar10 = 3;
    uVar11 = 0;
    while (uVar11 != 3) {
      ProjectPoint2dTriangToRib((int)uVar11,pt,&out);
      TPZManVector<double,_1>::TPZManVector(&outvec,1,&out);
      TPZVec<long>::TPZVec(&ids,2);
      plVar7 = id->fStore;
      *ids.fStore = plVar7[uVar11];
      uVar13 = 0;
      if (uVar11 != 2) {
        uVar13 = uVar11 + 1 & 0xffffffff;
      }
      ids.fStore[1] = plVar7[uVar13];
      uVar13 = (long)order->fStore[uVar11] - 1;
      TPZFNMatrix<50,_double>::TPZFNMatrix(&phin,uVar13,1);
      TPZFNMatrix<100,_double>::TPZFNMatrix(&dphin,2,uVar13);
      iVar5 = order->fStore[uVar11];
      iVar8 = TPZShapeLinear::GetTransformId1d(&ids);
      TPZShapeLinear::ShapeInternal
                (&outvec.super_TPZVec<double>,iVar5,&phin.super_TPZFMatrix<double>,
                 &dphin.super_TPZFMatrix<double>,iVar8);
      TransformDerivativeFromRibToTriang((int)uVar11,(int)uVar13,&dphin.super_TPZFMatrix<double>);
      lVar10 = (long)(int)lVar10;
      lVar12 = uVar11 + 3;
      uVar14 = uVar13 & 0xffffffff;
      if ((int)uVar13 < 1) {
        uVar14 = 0;
      }
      for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar12,0);
        dVar1 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar13,0);
        dVar2 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(phi,lVar10,0);
        *pdVar9 = dVar1 * dVar2;
        for (row = 0; row != 2; row = row + 1) {
          pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,row,lVar12);
          dVar1 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar13,0);
          dVar2 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar12,0);
          dVar3 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&dphin.super_TPZFMatrix<double>,row,uVar13);
          dVar4 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(dphi,row,lVar10);
          *pdVar9 = dVar1 * dVar2 + dVar3 * dVar4;
        }
        lVar10 = lVar10 + 1;
      }
      TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphin);
      TPZFNMatrix<50,_double>::~TPZFNMatrix(&phin);
      TPZVec<long>::~TPZVec(&ids);
      TPZManVector<double,_1>::~TPZManVector(&outvec);
      uVar11 = uVar11 + 1;
    }
    iVar5 = order->fStore[3];
    if (2 < iVar5) {
      uVar11 = (ulong)((uint)((iVar5 + -1) * (iVar5 + -2)) >> 1);
      TPZFNMatrix<50,_double>::TPZFNMatrix(&phin,uVar11,1);
      TPZFNMatrix<100,_double>::TPZFNMatrix(&dphin,2,uVar11);
      iVar5 = order->fStore[3];
      iVar8 = GetTransformId2dT(id);
      ShapeInternal(pt,iVar5 + -2,&phin.super_TPZFMatrix<double>,&dphin.super_TPZFMatrix<double>,
                    iVar8);
      lVar10 = (long)(int)lVar10;
      for (uVar13 = 0; uVar13 != uVar11; uVar13 = uVar13 + 1) {
        pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,6,0);
        dVar1 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar13,0);
        dVar2 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(phi,lVar10,0);
        *pdVar9 = dVar1 * dVar2;
        for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
          pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar12,6);
          dVar1 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar13,0);
          dVar2 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,6,0);
          dVar3 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&dphin.super_TPZFMatrix<double>,lVar12,uVar13);
          dVar4 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar12,lVar10);
          *pdVar9 = dVar1 * dVar2 + dVar3 * dVar4;
        }
        lVar10 = lVar10 + 1;
      }
      TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphin);
      TPZFNMatrix<50,_double>::~TPZFNMatrix(&phin);
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphiblend);
    TPZFNMatrix<50,_double>::~TPZFNMatrix(&phiblend);
  }
  return;
}

Assistant:

void TPZShapeTriang::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
							   TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		ShapeCorner(pt,phi,dphi);
		if (order[0] < 2 && order[1] < 2 && order[2] < 2 && order[3] < 3) return;
		int is,d;
    
        TPZFNMatrix<50,REAL> phiblend(NSides,1);
        TPZFNMatrix<100,REAL> dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		
		REAL out;
		int shape = 3;
		for (int rib = 0; rib < 3; rib++) {
			
			ProjectPoint2dTriangToRib(rib,pt,out);
			TPZManVector<REAL,1> outvec(1,out);
			TPZVec<int64_t> ids(2);
			ids[0] = id[rib%3];
			ids[1] = id[(rib+1)%3];
			int ord2 = order[rib]-1;//numero de shapes por lado rib
            TPZFNMatrix<50,REAL> phin(ord2,1);
            TPZFNMatrix<100,REAL>dphin(2,ord2);
			TPZShapeLinear *shplin=0;
			shplin->ShapeInternal(outvec,order[rib],phin,dphin,shplin->GetTransformId1d(ids));
//            dphin.Print("dphin= ",std::cout,EMathematicaInput);
			TransformDerivativeFromRibToTriang(rib,ord2,dphin);
			for (int i = 0; i < ord2; i++) {
				phi(shape,0) = phiblend(rib+3,0)*phin(i,0);
				for(int xj=0;xj<2;xj++) {
					dphi(xj,shape) = dphiblend(xj,rib+3)* phin( i, 0)+
					phiblend(rib+3, 0 )* dphin(xj,i);
				}
				shape++;
			}
		}
        
		if (order[3] < 3) return;//ordem na face
		int ord =  order[3]-2;//num de shapes da face
		int nsh = (ord*(ord+1))/2;
        TPZFNMatrix<50,REAL> phin(nsh,1);
        TPZFNMatrix<100,REAL> dphin(2,nsh);
		ShapeInternal(pt,order[3]-2, phin, dphin,GetTransformId2dT(id));
//         dphin.Print("dphin= ",std::cout,EMathematicaInput);
        
		for(int i=0;i<nsh;i++)	{//number of internal shape equal maximal order
			phi(shape,0) = phiblend(6,0)*phin(i,0);
			for(int d=0;d<2;d++) {
				dphi(d,shape) = dphiblend(d,6)* phin(i,0) +
				phiblend(6,0)*dphin(d,i);
			}
			shape++;
		}
	}